

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_table_function_info.cpp
# Opt level: O2

unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> __thiscall
duckdb::CreateTableFunctionInfo::Copy(CreateTableFunctionInfo *this)

{
  type other;
  pointer *__ptr;
  CreateFunctionInfo *in_RSI;
  TableFunctionSet set;
  unique_ptr<duckdb::CreateTableFunctionInfo,_std::default_delete<duckdb::CreateTableFunctionInfo>,_true>
  local_78;
  string local_70;
  FunctionSet<duckdb::TableFunction> local_50;
  
  ::std::__cxx11::string::string((string *)&local_70,(string *)&in_RSI->name);
  TableFunctionSet::TableFunctionSet((TableFunctionSet *)&local_50,&local_70);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>::operator=
            (&local_50.functions.
              super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>,
             (vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_> *)
             &in_RSI[1].super_CreateInfo.catalog.field_2);
  make_uniq<duckdb::CreateTableFunctionInfo,duckdb::TableFunctionSet>
            ((duckdb *)&local_78,(TableFunctionSet *)&local_50);
  other = unique_ptr<duckdb::CreateTableFunctionInfo,_std::default_delete<duckdb::CreateTableFunctionInfo>,_true>
          ::operator*(&local_78);
  CreateFunctionInfo::CopyFunctionProperties(in_RSI,&other->super_CreateFunctionInfo);
  (this->super_CreateFunctionInfo).super_CreateInfo.super_ParseInfo._vptr_ParseInfo =
       (_func_int **)
       local_78.
       super_unique_ptr<duckdb::CreateTableFunctionInfo,_std::default_delete<duckdb::CreateTableFunctionInfo>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::CreateTableFunctionInfo,_std::default_delete<duckdb::CreateTableFunctionInfo>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::CreateTableFunctionInfo_*,_std::default_delete<duckdb::CreateTableFunctionInfo>_>
       .super__Head_base<0UL,_duckdb::CreateTableFunctionInfo_*,_false>._M_head_impl;
  FunctionSet<duckdb::TableFunction>::~FunctionSet(&local_50);
  return (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)
         (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)this;
}

Assistant:

unique_ptr<CreateInfo> CreateTableFunctionInfo::Copy() const {
	TableFunctionSet set(name);
	set.functions = functions.functions;
	auto result = make_uniq<CreateTableFunctionInfo>(std::move(set));
	CopyFunctionProperties(*result);
	return std::move(result);
}